

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLURL::XMLURL(XMLURL *this,XMLURL *toCopy)

{
  XMLCh *pXVar1;
  OutOfMemoryException *anon_var_0;
  undefined1 local_30 [8];
  CleanupType_conflict6 cleanup;
  XMLURL *toCopy_local;
  XMLURL *this_local;
  
  this->_vptr_XMLURL = (_func_int **)&PTR__XMLURL_00526c98;
  this->fMemoryManager = toCopy->fMemoryManager;
  this->fFragment = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fPassword = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fPortNum = toCopy->fPortNum;
  this->fProtocol = toCopy->fProtocol;
  this->fQuery = (XMLCh *)0x0;
  this->fUser = (XMLCh *)0x0;
  this->fURLText = (XMLCh *)0x0;
  this->fHasInvalidChar = (bool)(toCopy->fHasInvalidChar & 1);
  cleanup._16_8_ = toCopy;
  JanitorMemFunCall<xercesc_4_0::XMLURL>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLURL> *)local_30,this,(MFPT)cleanUp);
  pXVar1 = XMLString::replicate(*(XMLCh **)(cleanup._16_8_ + 0x10),this->fMemoryManager);
  this->fFragment = pXVar1;
  pXVar1 = XMLString::replicate(*(XMLCh **)(cleanup._16_8_ + 0x18),this->fMemoryManager);
  this->fHost = pXVar1;
  pXVar1 = XMLString::replicate(*(XMLCh **)(cleanup._16_8_ + 0x20),this->fMemoryManager);
  this->fPassword = pXVar1;
  pXVar1 = XMLString::replicate(*(XMLCh **)(cleanup._16_8_ + 0x28),this->fMemoryManager);
  this->fPath = pXVar1;
  pXVar1 = XMLString::replicate(*(XMLCh **)(cleanup._16_8_ + 0x38),this->fMemoryManager);
  this->fQuery = pXVar1;
  pXVar1 = XMLString::replicate(*(XMLCh **)(cleanup._16_8_ + 0x40),this->fMemoryManager);
  this->fUser = pXVar1;
  pXVar1 = XMLString::replicate(*(XMLCh **)(cleanup._16_8_ + 0x48),this->fMemoryManager);
  this->fURLText = pXVar1;
  JanitorMemFunCall<xercesc_4_0::XMLURL>::release
            ((JanitorMemFunCall<xercesc_4_0::XMLURL> *)local_30);
  JanitorMemFunCall<xercesc_4_0::XMLURL>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLURL> *)local_30);
  return;
}

Assistant:

XMLURL::XMLURL(const XMLURL& toCopy) :
    XMemory(toCopy)
    , fMemoryManager(toCopy.fMemoryManager)
    , fFragment(0)
    , fHost(0)
    , fPassword(0)
    , fPath(0)
    , fPortNum(toCopy.fPortNum)
    , fProtocol(toCopy.fProtocol)
    , fQuery(0)
    , fUser(0)
    , fURLText(0)
    , fHasInvalidChar(toCopy.fHasInvalidChar)
{
    CleanupType cleanup(this, &XMLURL::cleanUp);

    try
    {
        fFragment = XMLString::replicate(toCopy.fFragment, fMemoryManager);
        fHost = XMLString::replicate(toCopy.fHost, fMemoryManager);
        fPassword = XMLString::replicate(toCopy.fPassword, fMemoryManager);
        fPath = XMLString::replicate(toCopy.fPath, fMemoryManager);
        fQuery = XMLString::replicate(toCopy.fQuery, fMemoryManager);
        fUser = XMLString::replicate(toCopy.fUser, fMemoryManager);
        fURLText = XMLString::replicate(toCopy.fURLText, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}